

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_copy_w16out_sse42
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 *puVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  int in_R9D;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i src3_16x8b;
  __m128i src2_16x8b;
  __m128i src1_16x8b;
  __m128i src0_16x8b;
  WORD32 col;
  WORD32 row;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  int local_3a4;
  int local_3a0;
  undefined8 *local_388;
  ulong *local_380;
  
  if ((int)(uint)src3_16x8b[1] % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x78,
                  "void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if (in_R9D % 4 != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x79,
                  "void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  local_388 = in_RSI;
  local_380 = in_RDI;
  if (((uint)src3_16x8b[1] & 7) == 0) {
    for (local_3a0 = 0; local_3a0 < in_R9D; local_3a0 = local_3a0 + 4) {
      for (local_3a4 = 0; local_3a4 < (int)(uint)src3_16x8b[1]; local_3a4 = local_3a4 + 8) {
        local_3b8._8_8_ = 0;
        local_3b8._0_8_ = *local_380;
        local_3c8._8_8_ = 0;
        local_3c8._0_8_ = *(ulong *)((long)local_380 + (long)in_EDX);
        local_3d8._0_8_ = *(ulong *)((long)local_380 + (long)(in_EDX * 2));
        local_3d8._8_8_ = 0;
        local_3e8._0_8_ = *(ulong *)((long)local_380 + (long)(in_EDX * 3));
        local_3e8._8_8_ = 0;
        auVar2 = pmovzxbw(local_3b8,*local_380);
        auVar3 = pmovzxbw(local_3c8,*(ulong *)((long)local_380 + (long)in_EDX));
        auVar4 = pmovzxbw(local_3d8,local_3d8._0_8_);
        auVar5 = pmovzxbw(local_3e8,local_3e8._0_8_);
        auVar2 = psllw(auVar2,ZEXT416(6));
        auVar3 = psllw(auVar3,ZEXT416(6));
        auVar4 = psllw(auVar4,ZEXT416(6));
        auVar5 = psllw(auVar5,ZEXT416(6));
        local_3b8._0_8_ = auVar2._0_8_;
        local_3b8._8_8_ = auVar2._8_8_;
        *local_388 = local_3b8._0_8_;
        local_388[1] = local_3b8._8_8_;
        puVar1 = (undefined8 *)((long)local_388 + (long)in_ECX * 2);
        local_3c8._0_8_ = auVar3._0_8_;
        local_3c8._8_8_ = auVar3._8_8_;
        *puVar1 = local_3c8._0_8_;
        puVar1[1] = local_3c8._8_8_;
        puVar1 = (undefined8 *)((long)local_388 + (long)(in_ECX << 1) * 2);
        local_3d8._0_8_ = auVar4._0_8_;
        local_3d8._8_8_ = auVar4._8_8_;
        *puVar1 = local_3d8._0_8_;
        puVar1[1] = local_3d8._8_8_;
        puVar1 = (undefined8 *)((long)local_388 + (long)(in_ECX * 3) * 2);
        local_3e8._0_8_ = auVar5._0_8_;
        local_3e8._8_8_ = auVar5._8_8_;
        *puVar1 = local_3e8._0_8_;
        puVar1[1] = local_3e8._8_8_;
        local_380 = local_380 + 1;
        local_388 = local_388 + 2;
      }
      local_380 = (ulong *)((long)local_380 + (long)(int)(in_EDX * 4 - (uint)src3_16x8b[1]));
      local_388 = (undefined8 *)
                  ((long)local_388 + (long)(int)(in_ECX * 4 - (uint)src3_16x8b[1]) * 2);
    }
  }
  else {
    for (local_3a0 = 0; local_3a0 < in_R9D; local_3a0 = local_3a0 + 4) {
      for (local_3a4 = 0; local_3a4 < (int)(uint)src3_16x8b[1]; local_3a4 = local_3a4 + 4) {
        local_3b8._8_8_ = 0;
        local_3b8._0_8_ = *local_380;
        local_3c8._8_8_ = 0;
        local_3c8._0_8_ = *(ulong *)((long)local_380 + (long)in_EDX);
        local_3d8._0_8_ = *(ulong *)((long)local_380 + (long)(in_EDX * 2));
        local_3d8._8_8_ = 0;
        local_3e8._0_8_ = *(ulong *)((long)local_380 + (long)(in_EDX * 3));
        local_3e8._8_8_ = 0;
        auVar2 = pmovzxbw(local_3b8,*local_380);
        auVar3 = pmovzxbw(local_3c8,*(ulong *)((long)local_380 + (long)in_EDX));
        auVar4 = pmovzxbw(local_3d8,local_3d8._0_8_);
        auVar5 = pmovzxbw(local_3e8,local_3e8._0_8_);
        auVar2 = psllw(auVar2,ZEXT416(6));
        auVar3 = psllw(auVar3,ZEXT416(6));
        auVar4 = psllw(auVar4,ZEXT416(6));
        auVar5 = psllw(auVar5,ZEXT416(6));
        local_3b8._0_8_ = auVar2._0_8_;
        *local_388 = local_3b8._0_8_;
        local_3c8._0_8_ = auVar3._0_8_;
        *(undefined8 *)((long)local_388 + (long)in_ECX * 2) = local_3c8._0_8_;
        local_3d8._0_8_ = auVar4._0_8_;
        *(undefined8 *)((long)local_388 + (long)(in_ECX * 2) * 2) = local_3d8._0_8_;
        local_3e8._0_8_ = auVar5._0_8_;
        *(undefined8 *)((long)local_388 + (long)(in_ECX * 3) * 2) = local_3e8._0_8_;
        local_380 = (ulong *)((long)local_380 + 4);
        local_388 = local_388 + 1;
      }
      local_380 = (ulong *)((long)local_380 + (long)(int)(in_EDX * 4 - (uint)src3_16x8b[1]));
      local_388 = (undefined8 *)
                  ((long)local_388 + (long)(int)(in_ECX * 4 - (uint)src3_16x8b[1]) * 2);
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    if(0 == (wd & 7)) /* multiple of 8 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 8; /* pointer update */
                pi2_dst += 8; /* pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pi2_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* storing 16 8-bit output values */
                _mm_storel_epi64((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 4; /* pointer update */
                pi2_dst += 4; /* pointer update */
            } /* inner for loop ends here(4-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pi2_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
}